

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_matrix.cpp
# Opt level: O3

void MatrixMultiply(Matrix m1,Matrix m2,Matrix prod)

{
  double *pdVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  if (((*(char *)((long)m1 + -6) == *(char *)((long)m2 + -7)) &&
      (bVar3 = *(byte *)((long)prod + -7), bVar3 == *(byte *)((long)m1 + -7))) &&
     (uVar5 = (ulong)*(byte *)((long)prod + -6),
     *(byte *)((long)prod + -6) == *(byte *)((long)m2 + -6))) {
    if (bVar3 != 0) {
      uVar2 = 0;
      do {
        if ((char)uVar5 == '\0') {
          uVar5 = 0;
        }
        else {
          pdVar1 = prod[uVar2];
          uVar4 = 0;
          do {
            if ((ulong)*(byte *)((long)m1 + -6) == 0) {
              dVar6 = 0.0;
            }
            else {
              dVar6 = 0.0;
              uVar5 = 0;
              do {
                dVar6 = dVar6 + m1[uVar2][uVar5] * m2[uVar5][uVar4];
                uVar5 = uVar5 + 1;
              } while (*(byte *)((long)m1 + -6) != uVar5);
            }
            pdVar1[uVar4] = dVar6;
            uVar4 = uVar4 + 1;
            uVar5 = (ulong)*(byte *)((long)m2 + -6);
          } while (uVar4 < uVar5);
          bVar3 = *(byte *)((long)m1 + -7);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < bVar3);
    }
    return;
  }
  Am_Error("MatrixMultiply");
}

Assistant:

void
MatrixMultiply(Matrix m1, Matrix m2, Matrix prod)
{
  int i, j, k;
  double sum;

  if (NCOLS(m1) != NROWS(m2))
    Am_Error("MatrixMultiply"); //: Can't multiply %dx%d and %dx%d matrices",
  //NROWS(m1), NCOLS(m1), NROWS(m2), NCOLS(m2));
  if (NROWS(prod) != NROWS(m1) || NCOLS(prod) != NCOLS(m2))
    Am_Error(
        "MatrixMultiply"); //: %dx%d times %dx%d does not give %dx%d product",
  //NROWS(m1), NCOLS(m1), NROWS(m2), NCOLS(m2),
  //NROWS(prod), NCOLS(prod));

  for (i = 0; i < NROWS(m1); i++)
    for (j = 0; j < NCOLS(m2); j++) {
      sum = 0;
      for (k = 0; k < NCOLS(m1); k++)
        sum += m1[i][k] * m2[k][j];
      prod[i][j] = sum;
    }
}